

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O2

int ffdrrg(fitsfile *fptr,char *ranges,int *status)

{
  LONGLONG maxrows;
  long lVar1;
  int iVar2;
  char *pcVar3;
  long *minrow;
  long *maxrow;
  ulong uVar4;
  long *rownum;
  long lVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  int nranges2;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar2 = ffrdef(fptr,status), 0 < iVar2))
    goto LAB_0013b191;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (fptr->Fptr->hdutype == 0) {
    ffpmsg("Can only delete rows in TABLE or BINTABLE extension (ffdrrg)");
    *status = 0xeb;
    return 0xeb;
  }
  maxrows = fptr->Fptr->numrows;
  sVar7 = 1;
  pcVar3 = ranges;
  while (pcVar3 = strchr(pcVar3,0x2c), pcVar3 != (char *)0x0) {
    pcVar3 = pcVar3 + 1;
    sVar7 = sVar7 + 1;
  }
  minrow = (long *)calloc(sVar7,8);
  maxrow = (long *)calloc(sVar7,8);
  if (minrow == (long *)0x0 || maxrow == (long *)0x0) {
    *status = 0x71;
    ffpmsg("failed to allocate memory for row ranges (ffdrrg)");
  }
  else {
    ffrwrg(ranges,maxrows,(int)sVar7,&nranges2,minrow,maxrow,status);
    iVar2 = *status;
    if (nranges2 == 0 || 0 < iVar2) {
      free(maxrow);
      free(minrow);
      return iVar2;
    }
    uVar4 = 0;
    uVar8 = (ulong)(uint)nranges2;
    if (nranges2 < 1) {
      uVar8 = uVar4;
    }
    sVar7 = 0;
    for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      sVar7 = ((sVar7 + maxrow[uVar4]) - minrow[uVar4]) + 1;
    }
    rownum = (long *)calloc(sVar7,8);
    if (rownum == (long *)0x0) {
      *status = 0x71;
      ffpmsg("failed to allocate memory for row array (ffdrrg)");
      goto LAB_0013b191;
    }
    lVar5 = 0;
    for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
      lVar1 = maxrow[uVar4];
      for (lVar6 = minrow[uVar4]; lVar6 <= lVar1; lVar6 = lVar6 + 1) {
        rownum[lVar5] = lVar6;
        lVar5 = lVar5 + 1;
      }
    }
    ffdrws(fptr,rownum,sVar7,status);
    free(rownum);
  }
  free(maxrow);
  free(minrow);
LAB_0013b191:
  return *status;
}

Assistant:

int ffdrrg(fitsfile *fptr,  /* I - FITS file pointer to table               */
           char *ranges,    /* I - ranges of rows to delete (1 = first)     */
           int *status)     /* IO - error status                            */
/*
 delete the ranges of rows from the table (1 = first row of table).

The 'ranges' parameter typically looks like:
    '10-20, 30 - 40, 55' or '50-'
and gives a list of rows or row ranges separated by commas.
*/
{
    char *cptr;
    int nranges, nranges2, ii;
    long *minrow, *maxrow, nrows, *rowarray, jj, kk;
    LONGLONG naxis2;
    
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
        /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffpmsg("Can only delete rows in TABLE or BINTABLE extension (ffdrrg)");
        return(*status = NOT_TABLE);
    }

    /* the NAXIS2 keyword may not be up to date, so use the structure value */
    naxis2 = (fptr->Fptr)->numrows;

    /* find how many ranges were specified ( = no. of commas in string + 1) */
    cptr = ranges;
    for (nranges = 1; (cptr = strchr(cptr, ',')); nranges++)
        cptr++;
 
    minrow = calloc(nranges, sizeof(long));
    maxrow = calloc(nranges, sizeof(long));

    if (!minrow || !maxrow) {
        *status = MEMORY_ALLOCATION;
        ffpmsg("failed to allocate memory for row ranges (ffdrrg)");
        if (maxrow) free(maxrow);
        if (minrow) free(minrow);
        return(*status);
    }

    /* parse range list into array of range min and max values */
    ffrwrg(ranges, naxis2, nranges, &nranges2, minrow, maxrow, status);
    if (*status > 0 || nranges2 == 0) {
        free(maxrow);
        free(minrow);
        return(*status);
    }

    /* determine total number or rows to delete */
    nrows = 0;
    for (ii = 0; ii < nranges2; ii++) {
       nrows = nrows + maxrow[ii] - minrow[ii] + 1;
    }

    rowarray = calloc(nrows, sizeof(long));
    if (!rowarray) {
        *status = MEMORY_ALLOCATION;
        ffpmsg("failed to allocate memory for row array (ffdrrg)");
        return(*status);
    }

    for (kk = 0, ii = 0; ii < nranges2; ii++) {
       for (jj = minrow[ii]; jj <= maxrow[ii]; jj++) {
           rowarray[kk] = jj;
           kk++;
       }
    }

    /* delete the rows */
    ffdrws(fptr, rowarray, nrows, status);
    
    free(rowarray);
    free(maxrow);
    free(minrow);
    return(*status);
}